

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O1

member_function_pointer<void,_void,_void,_void> * __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::member_function_pointer<void,_void,_void,_void>_>::
allocate_array(memory_manager_stateless_kernel_1<dlib::member_function_pointer<void,_void,_void,_void>_>
               *this,unsigned_long size)

{
  void *pvVar1;
  member_function_pointer<void,_void,_void,_void> *pmVar2;
  ulong uVar3;
  
  uVar3 = size << 6;
  pvVar1 = operator_new__(-(ulong)(size >> 0x3a != 0) | uVar3 | 0x10);
  *(unsigned_long *)((long)pvVar1 + 8) = size;
  pmVar2 = (member_function_pointer<void,_void,_void,_void> *)((long)pvVar1 + 0x10);
  if (size != 0) {
    do {
      (pmVar2->super_mfp_kernel_1_base_class<0UL>).mp_memory.data = pmVar2;
      *(undefined8 *)((long)&(pmVar2->super_mfp_kernel_1_base_class<0UL>).mp_memory.mem + 8) = 0;
      *(undefined4 *)((long)&(pmVar2->super_mfp_kernel_1_base_class<0UL>).mp_memory.mem + 0x10) = 2;
      *(undefined8 *)((long)&(pmVar2->super_mfp_kernel_1_base_class<0UL>).mp_memory.mem + 0x18) = 0;
      *(undefined8 *)((long)&(pmVar2->super_mfp_kernel_1_base_class<0UL>).mp_memory.mem + 0x20) = 0;
      (pmVar2->super_mfp_kernel_1_base_class<0UL>).mp_memory.mem.void_ptr =
           &PTR__mp_base_base_0031be08;
      uVar3 = uVar3 - 0x40;
      pmVar2 = pmVar2 + 1;
    } while (uVar3 != 0);
  }
  return (member_function_pointer<void,_void,_void,_void> *)((long)pvVar1 + 0x10);
}

Assistant:

T* allocate_array (
                unsigned long size
            ) 
            { 
                return new T[size];
            }